

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O1

void __thiscall chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChNameValue<char> *bVal)

{
  int iVar1;
  
  if (0 < *(int *)&(this->super_ChArchiveOut).field_0x104) {
    iVar1 = 0;
    do {
      chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)&(this->super_ChArchiveOut).field_0x104);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream,*(char **)bVal);
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\t");
  chrono::ChStreamOutAscii::operator<<(this->ostream,**(char **)(bVal + 8));
  chrono::ChStreamOutAscii::operator<<(this->ostream,"\n");
  return;
}

Assistant:

virtual void out     (ChNameValue<char> bVal){
            indent();
            (*ostream) << bVal.name();
            (*ostream) << "\t";
            (*ostream) << bVal.value();
            (*ostream) << "\n";
      }